

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86.cpp
# Opt level: O3

int __thiscall ncnn::PReLU_x86::forward_inplace(PReLU_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  uint uVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  _func_int **pp_Var7;
  int iVar8;
  int iVar9;
  float *slope;
  long lVar10;
  ulong uVar11;
  undefined1 (*pauVar12) [16];
  int iVar13;
  ulong uVar14;
  float *pfVar15;
  float fVar16;
  float fVar18;
  float fVar19;
  undefined1 auVar17 [16];
  float fVar20;
  undefined1 auVar21 [16];
  
  iVar8 = bottom_top_blob->dims;
  if (bottom_top_blob->elempack == 4) {
    if (iVar8 == 3) {
      iVar8 = bottom_top_blob->c;
      if (0 < (long)iVar8) {
        iVar9 = bottom_top_blob->h * bottom_top_blob->w;
        pp_Var7 = this->_vptr_PReLU_x86;
        lVar10 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var7[-3]) < 2) {
            fVar16 = **(float **)(&this->field_0xd8 + (long)pp_Var7[-3]);
            fVar18 = fVar16;
            fVar19 = fVar16;
            fVar20 = fVar16;
          }
          else {
            pfVar15 = *(float **)(&this->field_0xd8 + (long)pp_Var7[-3]) + lVar10 * 4;
            fVar16 = *pfVar15;
            fVar18 = pfVar15[1];
            fVar19 = pfVar15[2];
            fVar20 = pfVar15[3];
          }
          if (0 < iVar9) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->cstep * lVar10 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar9;
            do {
              auVar21 = maxps(*pauVar12,ZEXT816(0));
              auVar17 = minps(*pauVar12,ZEXT816(0));
              *(float *)*pauVar12 = auVar17._0_4_ * fVar16 + auVar21._0_4_;
              *(float *)(*pauVar12 + 4) = auVar17._4_4_ * fVar18 + auVar21._4_4_;
              *(float *)(*pauVar12 + 8) = auVar17._8_4_ * fVar19 + auVar21._8_4_;
              *(float *)(*pauVar12 + 0xc) = auVar17._12_4_ * fVar20 + auVar21._12_4_;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar8);
      }
    }
    else if (iVar8 == 2) {
      iVar8 = bottom_top_blob->h;
      if (0 < (long)iVar8) {
        iVar9 = bottom_top_blob->w;
        pp_Var7 = this->_vptr_PReLU_x86;
        lVar10 = 0;
        do {
          if (*(int *)(&this->field_0xd0 + (long)pp_Var7[-3]) < 2) {
            fVar16 = **(float **)(&this->field_0xd8 + (long)pp_Var7[-3]);
            fVar18 = fVar16;
            fVar19 = fVar16;
            fVar20 = fVar16;
          }
          else {
            pfVar15 = *(float **)(&this->field_0xd8 + (long)pp_Var7[-3]) + lVar10 * 4;
            fVar16 = *pfVar15;
            fVar18 = pfVar15[1];
            fVar19 = pfVar15[2];
            fVar20 = pfVar15[3];
          }
          if (0 < iVar9) {
            pauVar12 = (undefined1 (*) [16])
                       (bottom_top_blob->w * lVar10 * bottom_top_blob->elemsize +
                       (long)bottom_top_blob->data);
            iVar13 = iVar9;
            do {
              auVar21 = maxps(*pauVar12,ZEXT816(0));
              auVar17 = minps(*pauVar12,ZEXT816(0));
              *(float *)*pauVar12 = auVar17._0_4_ * fVar16 + auVar21._0_4_;
              *(float *)(*pauVar12 + 4) = auVar17._4_4_ * fVar18 + auVar21._4_4_;
              *(float *)(*pauVar12 + 8) = auVar17._8_4_ * fVar19 + auVar21._8_4_;
              *(float *)(*pauVar12 + 0xc) = auVar17._12_4_ * fVar20 + auVar21._12_4_;
              pauVar12 = pauVar12 + 1;
              iVar13 = iVar13 + -1;
            } while (iVar13 != 0);
          }
          lVar10 = lVar10 + 1;
        } while (lVar10 != iVar8);
      }
    }
    else if (iVar8 == 1) {
      uVar3 = bottom_top_blob->w;
      pfVar15 = *(float **)(&this->field_0xd8 + (long)this->_vptr_PReLU_x86[-3]);
      if (*(int *)(&this->field_0xd0 + (long)this->_vptr_PReLU_x86[-3]) < 2) {
        if (0 < (int)uVar3) {
          fVar16 = *pfVar15;
          lVar10 = 0;
          do {
            auVar17 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar10);
            auVar21 = maxps(auVar17,ZEXT816(0));
            auVar17 = minps(auVar17,ZEXT816(0));
            pfVar15 = (float *)((long)bottom_top_blob->data + lVar10);
            *pfVar15 = auVar17._0_4_ * fVar16 + auVar21._0_4_;
            pfVar15[1] = auVar17._4_4_ * fVar16 + auVar21._4_4_;
            pfVar15[2] = auVar17._8_4_ * fVar16 + auVar21._8_4_;
            pfVar15[3] = auVar17._12_4_ * fVar16 + auVar21._12_4_;
            lVar10 = lVar10 + 0x10;
          } while ((ulong)uVar3 << 4 != lVar10);
        }
      }
      else if (0 < (int)uVar3) {
        lVar10 = 0;
        do {
          auVar17 = *(undefined1 (*) [16])((long)bottom_top_blob->data + lVar10);
          pfVar1 = (float *)((long)pfVar15 + lVar10);
          fVar16 = pfVar1[1];
          fVar18 = pfVar1[2];
          fVar19 = pfVar1[3];
          auVar21 = maxps(auVar17,ZEXT816(0));
          auVar17 = minps(auVar17,ZEXT816(0));
          pfVar2 = (float *)((long)bottom_top_blob->data + lVar10);
          *pfVar2 = auVar17._0_4_ * *pfVar1 + auVar21._0_4_;
          pfVar2[1] = auVar17._4_4_ * fVar16 + auVar21._4_4_;
          pfVar2[2] = auVar17._8_4_ * fVar18 + auVar21._8_4_;
          pfVar2[3] = auVar17._12_4_ * fVar19 + auVar21._12_4_;
          lVar10 = lVar10 + 0x10;
        } while ((ulong)uVar3 << 4 != lVar10);
      }
    }
  }
  else {
    if (iVar8 != 3) {
      iVar8 = PReLU::forward_inplace
                        ((PReLU *)((long)&this->_vptr_PReLU_x86 + (long)this->_vptr_PReLU_x86[-3]),
                         bottom_top_blob,opt);
      return iVar8;
    }
    iVar8 = bottom_top_blob->c;
    if (0 < (long)iVar8) {
      iVar9 = bottom_top_blob->h * bottom_top_blob->w;
      pp_Var7 = this->_vptr_PReLU_x86;
      lVar10 = *(long *)(&this->field_0xd8 + (long)pp_Var7[-3]);
      pvVar4 = bottom_top_blob->data;
      sVar5 = bottom_top_blob->cstep;
      sVar6 = bottom_top_blob->elemsize;
      uVar11 = 0;
      do {
        uVar14 = uVar11 & 0xffffffff;
        if (*(int *)(&this->field_0xd0 + (long)pp_Var7[-3]) < 2) {
          uVar14 = 0;
        }
        if (0 < iVar9) {
          fVar16 = *(float *)(lVar10 + uVar14 * 4);
          pfVar15 = (float *)(sVar5 * sVar6 * uVar11 + (long)pvVar4);
          iVar13 = iVar9 + 1;
          do {
            if (*pfVar15 < 0.0) {
              *pfVar15 = *pfVar15 * fVar16;
            }
            pfVar15 = pfVar15 + 1;
            iVar13 = iVar13 + -1;
          } while (1 < iVar13);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (long)iVar8);
    }
  }
  return 0;
}

Assistant:

int PReLU_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _slope = _mm256_loadu_ps(slope + i * 8);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
            else
            {
                __m256 _slope = _mm256_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m256 _slope = num_slope > 1 ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(ptr, prelu_avx(_p, _slope));
                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            if (num_slope > 1)
            {
                const float* slope = slope_data;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _slope = _mm_loadu_ps(slope + i * 4);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
            else
            {
                __m128 _slope = _mm_set1_ps(slope_data[0]);

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                float* ptr = bottom_top_blob.row(i);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope_data[0]);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                float* ptr = bottom_top_blob.channel(q);
                __m128 _slope = num_slope > 1 ? _mm_loadu_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope_data[0]);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_loadu_ps(ptr);
                    _mm_storeu_ps(ptr, prelu_sse(_p, _slope));
                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return PReLU::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    const float* slope_data_ptr = slope_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        float slope = num_slope > 1 ? slope_data_ptr[q] : slope_data_ptr[0];

#if __AVX__
        int nn = size >> 3;
        int remain = size - (nn << 3);
#else
        int remain = size;
#endif // __AVX__

#if __AVX__
        for (; nn > 0; nn--)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, prelu_avx(_p, _mm256_set1_ps(slope)));
            ptr += 8;
        }
#endif // __AVX__
        for (; remain > 0; remain--)
        {
            if (*ptr < 0)
                *ptr *= slope;

            ptr++;
        }
    }

    return 0;
}